

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

PropertyIndex
Js::DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(PropertyIndex slotCapacity)

{
  PropertyIndex PVar1;
  
  PVar1 = 2;
  if (2 < slotCapacity) {
    PVar1 = (slotCapacity - 1 & 0xfffe) + 2;
  }
  return PVar1;
}

Assistant:

PropertyIndex DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(const PropertyIndex slotCapacity)
    {
        const PropertyIndex objectHeaderInlinableSlotCapacity = GetObjectHeaderInlinableSlotCapacity();
        if(slotCapacity <= objectHeaderInlinableSlotCapacity)
        {
            return objectHeaderInlinableSlotCapacity;
        }

        // Align the slot capacity for slots that are outside the object header, and add to that the slot capacity for slots
        // that are inside the object header
        return RoundUpInlineSlotCapacity(slotCapacity - objectHeaderInlinableSlotCapacity) + objectHeaderInlinableSlotCapacity;
    }